

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  bool bVar1;
  ImGuiStyle *pIVar2;
  ImGuiWindow *potential_parent;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool local_69;
  bool local_68;
  bool local_67;
  bool local_66;
  byte local_64;
  byte local_63;
  bool local_62;
  bool local_61;
  int local_48;
  bool mouse_dragging_extern_payload;
  bool mouse_avail_unless_popup_close;
  bool mouse_avail;
  int i;
  bool mouse_any_down;
  int mouse_earliest_down;
  bool has_open_modal;
  bool has_open_popup;
  ImGuiWindow *modal_window;
  bool clear_hovered_windows;
  ImVec2 local_20;
  ImGuiIO *local_18;
  ImGuiIO *io;
  ImGuiContext *g;
  
  io = (ImGuiIO *)GImGui;
  local_18 = &GImGui->IO;
  pIVar2 = &GImGui->Style;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,4.0,4.0);
  local_20 = ImMax(&pIVar2->TouchExtraPadding,(ImVec2 *)&stack0xffffffffffffffd8);
  *(ImVec2 *)(io[1].KeyMap + 0x1b5) = local_20;
  bVar1 = false;
  FindHoveredWindow();
  bVar3 = true;
  if ((*(long *)(io[1].KeyMap + 0x1ba) != 0) &&
     (bVar3 = true, *(long *)(io[1].KeyMap + 0x1ba) != *(long *)(io[1].KeyMap + 0x1c0))) {
    bVar3 = *(long *)(*(long *)(io[1].KeyMap + 0x1ba) + 0x30) == *(long *)(io[1].KeyMap + 0x24a);
  }
  if (!bVar3) {
    __assert_fail("g.HoveredWindow == __null || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x10f2,"void ImGui::UpdateHoveredWindowAndCaptureFlags()");
  }
  potential_parent = GetTopMostPopupModal();
  if (((potential_parent != (ImGuiWindow *)0x0) && (*(long *)(io[1].KeyMap + 0x1ba) != 0)) &&
     (bVar3 = IsWindowWithinBeginStackOf
                        (*(ImGuiWindow **)(*(long *)(io[1].KeyMap + 0x1ba) + 0x398),potential_parent
                        ), !bVar3)) {
    bVar1 = true;
  }
  if ((local_18->ConfigFlags & 0x10U) != 0) {
    bVar1 = true;
  }
  bVar3 = 0 < io[1].KeyMap[0x238];
  i = -1;
  bVar4 = false;
  for (local_48 = 0; local_48 < 5; local_48 = local_48 + 1) {
    if ((local_18->MouseClicked[local_48] & 1U) != 0) {
      local_61 = *(long *)(io[1].KeyMap + 0x1ba) != 0 || bVar3;
      local_18->MouseDownOwned[local_48] = local_61;
      local_62 = *(long *)(io[1].KeyMap + 0x1ba) != 0 || potential_parent != (ImGuiWindow *)0x0;
      local_18->MouseDownOwnedUnlessPopupClose[local_48] = local_62;
    }
    bVar4 = bVar4 || (local_18->MouseDown[local_48] & 1U) != 0;
    if (((local_18->MouseDown[local_48] & 1U) != 0) &&
       ((i == -1 || (local_18->MouseClickedTime[local_48] < local_18->MouseClickedTime[i])))) {
      i = local_48;
    }
  }
  local_63 = 1;
  if (i != -1) {
    local_63 = local_18->MouseDownOwned[i];
  }
  local_64 = 1;
  if (i != -1) {
    local_64 = local_18->MouseDownOwnedUnlessPopupClose[i];
  }
  bVar5 = false;
  if ((io[1].KeysDown[0xe8] & 1U) != 0) {
    bVar5 = (*(uint *)(io[1].KeysDown + 0xec) & 0x10) != 0;
  }
  if (((local_63 & 1) == 0) && (!bVar5)) {
    bVar1 = true;
  }
  if (bVar1) {
    io[1].KeyMap[0x1bc] = 0;
    io[1].KeyMap[0x1bd] = 0;
    io[1].KeyMap[0x1ba] = 0;
    io[1].KeyMap[0x1bb] = 0;
  }
  if (io[1].KeysData[0x122].AnalogValue == -NAN) {
    if (((local_63 & 1) == 0) ||
       ((local_66 = true, *(long *)(io[1].KeyMap + 0x1ba) == 0 && (local_66 = true, !bVar4)))) {
      local_66 = bVar3;
    }
    local_18->WantCaptureMouse = local_66;
    if (((local_64 & 1) == 0) ||
       ((local_67 = true, *(long *)(io[1].KeyMap + 0x1ba) == 0 && (local_67 = true, !bVar4)))) {
      local_67 = potential_parent != (ImGuiWindow *)0x0;
    }
    local_18->WantCaptureMouseUnlessPopupClose = local_67;
  }
  else {
    bVar3 = io[1].KeysData[0x122].AnalogValue != 0.0;
    local_18->WantCaptureMouseUnlessPopupClose = bVar3;
    local_18->WantCaptureMouse = bVar3;
  }
  if (*(int *)(io[1].KeysData + 0x123) == -1) {
    local_68 = io[1].KeyMap[0x1cd] != 0 || potential_parent != (ImGuiWindow *)0x0;
    local_18->WantCaptureKeyboard = local_68;
  }
  else {
    local_18->WantCaptureKeyboard = *(int *)(io[1].KeysData + 0x123) != 0;
  }
  if ((((local_18->NavActive & 1U) != 0) && ((local_18->ConfigFlags & 1U) != 0)) &&
     ((local_18->ConfigFlags & 8U) == 0)) {
    local_18->WantCaptureKeyboard = true;
  }
  if (io[1].KeysData[0x123].DownDuration == -NAN) {
    local_69 = false;
  }
  else {
    local_69 = io[1].KeysData[0x123].DownDuration != 0.0;
  }
  local_18->WantTextInput = local_69;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowWithinBeginStackOf(g.HoveredWindow->RootWindow, modal_window)) // FIXME-MERGE: RootWindowDockTree ?
        clear_hovered_windows = true;

    // Disabled mouse?
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and
    // won't report hovering nor request capture even while dragging over our windows afterward.
    const bool has_open_popup = (g.OpenPopupStack.Size > 0);
    const bool has_open_modal = (modal_window != NULL);
    int mouse_earliest_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        if (io.MouseClicked[i])
        {
            io.MouseDownOwned[i] = (g.HoveredWindow != NULL) || has_open_popup;
            io.MouseDownOwnedUnlessPopupClose[i] = (g.HoveredWindow != NULL) || has_open_modal;
        }
        mouse_any_down |= io.MouseDown[i];
        if (io.MouseDown[i])
            if (mouse_earliest_down == -1 || io.MouseClickedTime[i] < io.MouseClickedTime[mouse_earliest_down])
                mouse_earliest_down = i;
    }
    const bool mouse_avail = (mouse_earliest_down == -1) || io.MouseDownOwned[mouse_earliest_down];
    const bool mouse_avail_unless_popup_close = (mouse_earliest_down == -1) || io.MouseDownOwnedUnlessPopupClose[mouse_earliest_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to Dear ImGui only, false = dispatch mouse to Dear ImGui + underlying app)
    // Update io.WantCaptureMouseAllowPopupClose (experimental) to give a chance for app to react to popup closure with a drag
    if (g.WantCaptureMouseNextFrame != -1)
    {
        io.WantCaptureMouse = io.WantCaptureMouseUnlessPopupClose = (g.WantCaptureMouseNextFrame != 0);
    }
    else
    {
        io.WantCaptureMouse = (mouse_avail && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_popup;
        io.WantCaptureMouseUnlessPopupClose = (mouse_avail_unless_popup_close && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_modal;
    }

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to Dear ImGui only, false = dispatch keyboard info to Dear ImGui + underlying app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        io.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        io.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (io.NavActive && (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        io.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    io.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}